

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_print_stat(REF_HISTOGRAM ref_histogram)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  
  printf("mom ");
  for (uVar4 = 0; (long)uVar4 < (long)ref_histogram->nstat; uVar4 = uVar4 + 1) {
    printf("%12.8f(%d)",ref_histogram->stats[uVar4],uVar4 & 0xffffffff);
  }
  putchar(10);
  dVar1 = ref_histogram->stats[3];
  dVar5 = pow(ref_histogram->stats[2],1.5);
  auVar9._0_8_ = dVar5 * 1e+20;
  auVar9._8_8_ = dVar1;
  auVar7._8_8_ = -dVar1;
  auVar7._0_8_ = -auVar9._0_8_;
  auVar9 = maxpd(auVar9,auVar7);
  dVar8 = ref_histogram->stats[2];
  dVar2 = ref_histogram->stats[4];
  dVar8 = dVar8 * dVar8;
  auVar6._0_8_ = dVar8 * 1e+20;
  auVar6._8_8_ = dVar2;
  auVar3._8_8_ = -dVar2;
  auVar3._0_8_ = -auVar6._0_8_;
  auVar7 = maxpd(auVar6,auVar3);
  printf("skewness %12.8f kurtosis %12.8f\n",
         -(ulong)(auVar9._8_8_ < auVar9._0_8_) & (ulong)(dVar1 / dVar5),
         -(ulong)(auVar7._8_8_ < auVar7._0_8_) & (ulong)(dVar2 / dVar8 + -3.0));
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_print_stat(REF_HISTOGRAM ref_histogram) {
  REF_INT i;
  REF_DBL skewness, kurtosis, n, d;

  printf("mom ");
  for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
    printf("%12.8f(%d)", ref_histogram_stat(ref_histogram, i), i);
  printf("\n");

  n = ref_histogram_stat(ref_histogram, 3);
  d = pow(ref_histogram_stat(ref_histogram, 2), 1.5);
  skewness = 0.0;
  if (ref_math_divisible(n, d)) skewness = n / d;

  n = ref_histogram_stat(ref_histogram, 4);
  d = pow(ref_histogram_stat(ref_histogram, 2), 2);
  kurtosis = 0.0;
  if (ref_math_divisible(n, d)) kurtosis = n / d - 3.0;

  printf("skewness %12.8f kurtosis %12.8f\n", skewness, kurtosis);

  return REF_SUCCESS;
}